

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalExport::BuildPipelines
          (PhysicalExport *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  PipelineBuildState *this_00;
  
  this_00 = MetaPipeline::GetState(meta_pipeline);
  PipelineBuildState::SetPipelineSource(this_00,current,&this->super_PhysicalOperator);
  if ((this->super_PhysicalOperator).children.
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_PhysicalOperator).children.
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    PhysicalOperator::BuildPipelines(&this->super_PhysicalOperator,current,meta_pipeline);
    return;
  }
  return;
}

Assistant:

void PhysicalExport::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	// EXPORT has an optional child
	// we only need to schedule child pipelines if there is a child
	auto &state = meta_pipeline.GetState();
	state.SetPipelineSource(current, *this);
	if (children.empty()) {
		return;
	}
	PhysicalOperator::BuildPipelines(current, meta_pipeline);
}